

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O0

void check_leash(xchar x,xchar y)

{
  uint uVar1;
  boolean bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  long save_pacifism;
  monst *mtmp;
  obj *otmp;
  xchar y_local;
  xchar x_local;
  
  mtmp = (monst *)invent;
  do {
    if (mtmp == (monst *)0x0) {
      return;
    }
    if ((*(short *)((long)&mtmp->m_id + 2) == 0xf1) &&
       (iVar3._0_1_ = mtmp->my, iVar3._1_1_ = mtmp->mux, iVar3._2_1_ = mtmp->muy,
       iVar3._3_1_ = mtmp->malign, iVar3 != 0)) {
      for (save_pacifism = (long)level->monlist;
          (save_pacifism != 0 &&
          ((*(int *)(save_pacifism + 0x2c) < 1 ||
           (iVar4._0_1_ = mtmp->my, iVar4._1_1_ = mtmp->mux, iVar4._2_1_ = mtmp->muy,
           iVar4._3_1_ = mtmp->malign, *(int *)(save_pacifism + 0x28) != iVar4))));
          save_pacifism = *(long *)save_pacifism) {
      }
      if (save_pacifism == 0) {
        impossible("leash in use isn\'t attached to anything?");
        mtmp->my = '\0';
        mtmp->mux = '\0';
        mtmp->muy = '\0';
        mtmp->malign = '\0';
      }
      else {
        iVar3 = dist2((int)u.ux,(int)u.uy,(int)*(char *)(save_pacifism + 0x4f),
                      (int)*(char *)(save_pacifism + 0x50));
        iVar4 = dist2((int)x,(int)y,(int)*(char *)(save_pacifism + 0x4f),
                      (int)*(char *)(save_pacifism + 0x50));
        if ((iVar4 < iVar3) &&
           (bVar2 = um_dist(*(xchar *)(save_pacifism + 0x4f),*(xchar *)(save_pacifism + 0x50),'\x03'
                           ), bVar2 != '\0')) {
          if (((*(uint *)(mtmp->mtrack + 3) & 1) == 0) ||
             ((*(uint *)(*(long *)(save_pacifism + 8) + 0x30) & 0x400) != 0)) {
            bVar2 = um_dist(*(xchar *)(save_pacifism + 0x4f),*(xchar *)(save_pacifism + 0x50),'\x05'
                           );
            if (bVar2 == '\0') {
              pline("You pull on the leash.");
              if (*(char *)(*(long *)(save_pacifism + 8) + 0x2e) != '\0') {
                iVar3 = rn2(3);
                if (iVar3 == 0) {
                  growl((monst *)save_pacifism);
                }
                else if (iVar3 == 1) {
                  yelp((monst *)save_pacifism);
                }
                else {
                  whimper((monst *)save_pacifism);
                }
              }
            }
            else {
              pcVar5 = Monnam((monst *)save_pacifism);
              s_suffix(pcVar5);
              pline("%s leash snaps loose!");
              m_unleash((monst *)save_pacifism,'\0');
            }
          }
          else {
            bVar2 = um_dist(*(xchar *)(save_pacifism + 0x4f),*(xchar *)(save_pacifism + 0x50),'\x05'
                           );
            if (bVar2 == '\0') {
              iVar3 = rnd(2);
              iVar3 = *(int *)(save_pacifism + 0x2c) - iVar3;
              *(int *)(save_pacifism + 0x2c) = iVar3;
              if (0 < iVar3) {
                pcVar5 = Monnam((monst *)save_pacifism);
                pline("%s chokes on the leash!",pcVar5);
                if ((*(char *)(save_pacifism + 0x58) != '\0') &&
                   (iVar3 = rn2((int)*(char *)(save_pacifism + 0x58)), iVar3 != 0)) {
                  *(char *)(save_pacifism + 0x58) = *(char *)(save_pacifism + 0x58) + -1;
                }
                goto LAB_0014718e;
              }
            }
            uVar1 = u.uconduct.killer;
            mon_nam((monst *)save_pacifism);
            pline("Your leash chokes %s to death!");
            xkilled((monst *)save_pacifism,0);
            if (0 < *(int *)(save_pacifism + 0x2c)) {
              u.uconduct.killer = uVar1;
            }
          }
        }
      }
    }
LAB_0014718e:
    mtmp = mtmp->nmon;
  } while( true );
}

Assistant:

void check_leash(xchar x, xchar y)
{
	struct obj *otmp;
	struct monst *mtmp;

	for (otmp = invent; otmp; otmp = otmp->nobj) {
	    if (otmp->otyp != LEASH || otmp->leashmon == 0) continue;
	    for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
		if (DEADMONSTER(mtmp)) continue;
		if ((int)mtmp->m_id == otmp->leashmon) break; 
	    }
	    if (!mtmp) {
		impossible("leash in use isn't attached to anything?");
		otmp->leashmon = 0;
		continue;
	    }
	    if (dist2(u.ux,u.uy,mtmp->mx,mtmp->my) >
		    dist2(x,y,mtmp->mx,mtmp->my)) {
		if (!um_dist(mtmp->mx, mtmp->my, 3)) {
		    ;	/* still close enough */
		} else if (otmp->cursed && !breathless(mtmp->data)) {
		    if (um_dist(mtmp->mx, mtmp->my, 5) ||
			    (mtmp->mhp -= rnd(2)) <= 0) {
			long save_pacifism = u.uconduct.killer;

			pline("Your leash chokes %s to death!", mon_nam(mtmp));
			/* hero might not have intended to kill pet, but
			   that's the result of his actions; gain experience,
			   lose pacifism, take alignment and luck hit, make
			   corpse less likely to remain tame after revival */
			xkilled(mtmp, 0);	/* no "you kill it" message */
			/* life-saving doesn't ordinarily reset this */
			if (mtmp->mhp > 0) u.uconduct.killer = save_pacifism;
		    } else {
			pline("%s chokes on the leash!", Monnam(mtmp));
			/* tameness eventually drops to 1 here (never 0) */
			if (mtmp->mtame && rn2(mtmp->mtame)) mtmp->mtame--;
		    }
		} else {
		    if (um_dist(mtmp->mx, mtmp->my, 5)) {
			pline("%s leash snaps loose!", s_suffix(Monnam(mtmp)));
			m_unleash(mtmp, FALSE);
		    } else {
			pline("You pull on the leash.");
			if (mtmp->data->msound != MS_SILENT)
			    switch (rn2(3)) {
			    case 0:  growl(mtmp);   break;
			    case 1:  yelp(mtmp);    break;
			    default: whimper(mtmp); break;
			    }
		    }
		}
	    }
	}
}